

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_secondary_csv_actions::heading(module_secondary_csv_actions *this,string *module)

{
  ostream *poVar1;
  
  if (s_csv_table_marker == '\0') {
    poVar1 = std::operator<<((ostream *)&std::cout,"[Secondary]");
    poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,(string *)module);
    std::operator<<(poVar1,"\n");
  }
  if (s_csv_table_header != '\0') {
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Module");
  poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  std::operator<<(poVar1,"Adds\n");
  return;
}

Assistant:

void heading( std::string const & module )
    {
        if( s_csv_table_marker )
            std::cout << "[Secondary]" << s_csv_separator << module << "\n";
        if( s_csv_table_header )
            std::cout << "Module" << s_csv_separator << "Adds\n";
    }